

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_choice(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  ly_stmt lVar1;
  lysp_node *plVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  char *pcVar4;
  ly_ctx *local_d8;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  LY_ERR ret___17;
  LY_ERR ret___16;
  LY_ERR ret___15;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  long *plStack_58;
  LY_ERR ret___1;
  char **iter__;
  size_t offset__;
  char *p__;
  LY_ERR ret__;
  lysp_node_choice *choice;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  parent_00 = (lysp_node *)calloc(1,0x68);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(local_b0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_choice");
    return LY_EMEM;
  }
  if (*siblings == (lysp_node *)0x0) {
    *siblings = parent_00;
  }
  else {
    plVar2 = *siblings;
    while (plStack_58 = (long *)((long)plVar2 + (long)*siblings + (0x10 - (long)*siblings)),
          *plStack_58 != 0) {
      plVar2 = (lysp_node *)*plStack_58;
    }
    *plStack_58 = (long)parent_00;
  }
  if (ctx == (lysp_ctx *)0x0) {
    local_b8 = (ly_ctx *)0x0;
  }
  else {
    local_b8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar3 = lydict_insert(local_b8,stmt->arg,0,&parent_00->name);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  parent_00->nodetype = 2;
  parent_00->parent = parent;
  _ret___3 = stmt->child;
  do {
    if (_ret___3 == (lysp_stmt *)0x0) {
      return LY_SUCCESS;
    }
    lVar1 = _ret___3->kw;
    if (lVar1 == LY_STMT_ANYDATA) {
      if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema < 2) {
        if (ctx == (lysp_ctx *)0x0) {
          local_c8 = (ly_ctx *)0x0;
        }
        else {
          local_c8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ,"anydata","choice");
        return LY_EVALID;
      }
LAB_001ad234:
      LVar3 = lysp_stmt_any(ctx,_ret___3,parent_00,&parent_00[1].parent);
joined_r0x001ad25a:
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    else {
      if (lVar1 == LY_STMT_ANYXML) goto LAB_001ad234;
      if (lVar1 == LY_STMT_CASE) {
        LVar3 = lysp_stmt_case(ctx,_ret___3,parent_00,&parent_00[1].parent);
        goto joined_r0x001ad25a;
      }
      if (lVar1 == LY_STMT_CHOICE) {
        if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema < 2)
        {
          if (ctx == (lysp_ctx *)0x0) {
            local_d0 = (ly_ctx *)0x0;
          }
          else {
            local_d0 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ,"choice");
          return LY_EVALID;
        }
        LVar3 = lysp_stmt_choice(ctx,_ret___3,parent_00,&parent_00[1].parent);
        goto joined_r0x001ad25a;
      }
      if (lVar1 == LY_STMT_CONTAINER) {
        LVar3 = lysp_stmt_container(ctx,_ret___3,parent_00,&parent_00[1].parent);
        goto joined_r0x001ad25a;
      }
      if (lVar1 == LY_STMT_LEAF) {
        LVar3 = lysp_stmt_leaf(ctx,_ret___3,parent_00,&parent_00[1].parent);
        goto joined_r0x001ad25a;
      }
      if (lVar1 == LY_STMT_LEAF_LIST) {
        LVar3 = lysp_stmt_leaflist(ctx,_ret___3,parent_00,&parent_00[1].parent);
        goto joined_r0x001ad25a;
      }
      if (lVar1 == LY_STMT_LIST) {
        LVar3 = lysp_stmt_list(ctx,_ret___3,parent_00,&parent_00[1].parent);
        goto joined_r0x001ad25a;
      }
      if (lVar1 == LY_STMT_CONFIG) {
        LVar3 = lysp_stmt_config(ctx,_ret___3,&parent_00->flags,&parent_00->exts);
        goto joined_r0x001ad25a;
      }
      if (lVar1 != LY_STMT_DEFAULT) {
        if (lVar1 == LY_STMT_DESCRIPTION) {
          LVar3 = lysp_stmt_text_field(ctx,_ret___3,0,&parent_00->dsc,Y_STR_ARG,&parent_00->exts);
        }
        else {
          if (lVar1 != LY_STMT_EXTENSION_INSTANCE) {
            if (lVar1 == LY_STMT_IF_FEATURE) {
              LVar3 = lysp_stmt_qnames(ctx,_ret___3,&parent_00->iffeatures,Y_STR_ARG,
                                       &parent_00->exts);
            }
            else if (lVar1 == LY_STMT_MANDATORY) {
              LVar3 = lysp_stmt_mandatory(ctx,_ret___3,&parent_00->flags,&parent_00->exts);
            }
            else if (lVar1 == LY_STMT_REFERENCE) {
              LVar3 = lysp_stmt_text_field
                                (ctx,_ret___3,0,&parent_00->ref,Y_STR_ARG,&parent_00->exts);
            }
            else if (lVar1 == LY_STMT_STATUS) {
              LVar3 = lysp_stmt_status(ctx,_ret___3,&parent_00->flags,&parent_00->exts);
            }
            else {
              if (lVar1 != LY_STMT_WHEN) {
                if (ctx == (lysp_ctx *)0x0) {
                  local_d8 = (ly_ctx *)0x0;
                }
                else {
                  local_d8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
                ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"choice");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_when(ctx,_ret___3,(lysp_when **)&parent_00[1].nodetype);
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            goto LAB_001ad53d;
          }
          LVar3 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_CHOICE,0,&parent_00->exts);
        }
        goto joined_r0x001ad25a;
      }
      LVar3 = lysp_stmt_text_field
                        (ctx,_ret___3,0,(char **)&parent_00[1].next,Y_PREF_IDENTIF_ARG,
                         &parent_00->exts);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      parent_00[1].name = (char *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
LAB_001ad53d:
    _ret___3 = _ret___3->next;
  } while( true );
}

Assistant:

static LY_ERR
lysp_stmt_choice(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_choice *choice;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new choice structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, choice, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &choice->name));
    choice->nodetype = LYS_CHOICE;
    choice->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &choice->flags, &choice->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &choice->dsc, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &choice->iffeatures, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &choice->flags, &choice->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &choice->ref, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &choice->flags, &choice->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &choice->when));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &choice->dflt.str, Y_PREF_IDENTIF_ARG, &choice->exts));
            choice->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "choice");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_CASE:
            LY_CHECK_RET(lysp_stmt_case(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_CHOICE:
            PARSER_CHECK_STMTVER2_RET(ctx, "choice", "choice");
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &choice->node, &choice->child));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_CHOICE, 0, &choice->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "choice");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}